

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::IsNatural(ON_NurbsSurface *this,int dir,int end)

{
  long lVar1;
  double dVar2;
  double local_48;
  double parameter_list [2];
  size_t parameter_count;
  ON_Interval domain;
  int end_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  if ((((dir < 0) || (1 < dir)) || (end < 0)) || (2 < end)) {
    this_local._7_1_ = false;
  }
  else {
    domain.m_t[1]._0_4_ = end;
    domain.m_t[1]._4_4_ = dir;
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    parameter_list[1] = 0.0;
    local_48 = ON_DBL_QNAN;
    parameter_list[0] = ON_DBL_QNAN;
    if ((domain.m_t[1]._0_4_ == 0) || (domain.m_t[1]._0_4_ == 2)) {
      dVar2 = ON_Interval::operator[]((ON_Interval *)&parameter_count,0);
      lVar1 = (long)parameter_list[1] + -1;
      parameter_list[1] = (double)((long)parameter_list[1] + 1);
      parameter_list[lVar1] = dVar2;
    }
    if ((domain.m_t[1]._0_4_ == 1) || (domain.m_t[1]._0_4_ == 2)) {
      dVar2 = ON_Interval::operator[]((ON_Interval *)&parameter_count,1);
      lVar1 = (long)parameter_list[1] + -1;
      parameter_list[1] = (double)((long)parameter_list[1] + 1);
      parameter_list[lVar1] = dVar2;
    }
    this_local._7_1_ = IsNatural(this,domain.m_t[1]._4_4_,(size_t)parameter_list[1],&local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsSurface::IsNatural(int dir, int end) const
{
  if (dir < 0 || dir > 1 || end < 0 || end > 2)
    return false;

  const ON_Interval domain = Domain(dir);
  size_t parameter_count = 0;
  double parameter_list[2] = {ON_DBL_QNAN,ON_DBL_QNAN};
  if (0 == end || 2 == end)
    parameter_list[parameter_count++] = domain[0];
  if (1 == end || 2 == end)
    parameter_list[parameter_count++] = domain[1];
  return ON_NurbsSurface::IsNatural(dir, parameter_count, parameter_list);
}